

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_hc::create_color_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  int *piVar1;
  ushort uVar2;
  color_cluster *pcVar3;
  uint uVar4;
  ulong uVar5;
  uint (*pauVar6) [16];
  uint (*pauVar7) [256];
  uint p_1;
  ulong uVar8;
  color_quad_u8 *e2;
  uint (*pauVar9) [4];
  uint p;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint s_4;
  long lVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint s;
  long lVar18;
  uint local_1358;
  uint E2 [16] [4];
  uint E4 [8] [16];
  uint E8 [4] [256];
  
  uVar8 = (ulong)(this->m_num_blocks >> (this->m_has_subblocks & 0x1fU));
  uVar12 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
  uVar5 = (uVar8 * data) / uVar12;
  while( true ) {
    pauVar9 = E2;
    local_1358 = (uint)(((data + 1) * uVar8) / uVar12);
    uVar16 = (uint)uVar5;
    if (local_1358 <= uVar16) break;
    pcVar3 = (this->m_color_clusters).m_p;
    uVar2 = (this->m_endpoint_indices).m_p[uVar5 & 0xffffffff].field_0.field_0.color;
    for (uVar10 = 0; uVar10 != 0x10; uVar10 = uVar10 + 1) {
      lVar18 = 0;
      for (lVar17 = 0x48; lVar17 != 0x58; lVar17 = lVar17 + 4) {
        if (this->m_has_subblocks == true) {
          e2 = (color_quad_u8 *)
               ((long)&(this->m_color_clusters).m_p
                       [(this->m_endpoint_indices).m_p
                        [(uint)(uVar10 >> 3) & 0x1fffffff | uVar16 * 2].field_0.field_0.color].
                       blocks[0].m_p + lVar17);
        }
        else {
          e2 = pcVar3[uVar2].color_values + lVar18;
        }
        uVar4 = crnlib::color::color_distance
                          ((this->m_params).m_perceptual,this->m_blocks[uVar5 & 0xffffffff] + uVar10
                           ,e2,false);
        *(uint *)((long)pauVar9[-5] + lVar17 + 8) = uVar4;
        lVar18 = lVar18 + 1;
      }
      pauVar9 = pauVar9 + 1;
    }
    pauVar6 = E4;
    pauVar9 = E2;
    for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
      for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
        (*pauVar6)[lVar18] =
             *(int *)((long)E2[lVar17 * 2 + 1] + (ulong)((uint)lVar18 & 0xfffffffc)) +
             E2[lVar17 * 2][(uint)lVar18 & 3];
      }
      pauVar6 = pauVar6 + 1;
    }
    pauVar7 = E8;
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      for (uVar5 = 0; uVar5 != 0x100; uVar5 = uVar5 + 1) {
        (*pauVar7)[uVar5] =
             E4[lVar17 * 2 + 1][uVar5 >> 4 & 0xfffffff] + E4[lVar17 * 2][(uint)uVar5 & 0xf];
      }
      pauVar7 = pauVar7 + 1;
    }
    uVar5 = 0;
    uVar11 = 0xffffffff;
    for (uVar10 = 0; (this->m_color_selectors).m_size != uVar10; uVar10 = uVar10 + 1) {
      uVar15 = (this->m_color_selectors).m_p[uVar10];
      uVar15 = E8[1][uVar15 >> 8 & 0xff] + E8[0][uVar15 & 0xff] +
               *(int *)((long)E8[2] + (ulong)(uVar15 >> 0xe & 0x3fc)) + E8[3][uVar15 >> 0x18];
      if (uVar15 < uVar11) {
        uVar5 = uVar10 & 0xffffffff;
        uVar11 = uVar15;
      }
    }
    lVar18 = uVar5 * 0x104 + *pData_ptr;
    lVar17 = lVar18;
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
        piVar1 = (int *)(lVar17 + lVar14 * 4);
        *piVar1 = *piVar1 + (*pauVar9)[lVar14];
      }
      pauVar9 = pauVar9 + 1;
      lVar17 = lVar17 + 0x10;
    }
    *(undefined1 *)(lVar18 + 0x100) = 1;
    (this->m_selector_indices).m_p[uVar16 << (this->m_has_subblocks & 0x1fU)].field_0.field_0.color
         = (uint16)uVar5;
    uVar5 = (ulong)(uVar16 + 1);
  }
  return;
}

Assistant:

void dxt_hc::create_color_selector_codebook_task(uint64 data, void* pData_ptr)
    {
        crnlib::vector<color_selector_details>& selector_details = *static_cast<crnlib::vector<color_selector_details>*>(pData_ptr);
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint E2[16][4];
        uint E4[8][16];
        uint E8[4][256];
        for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++)
        {
            color_cluster& cluster = m_color_clusters[m_endpoint_indices[b].color];
            color_quad_u8* endpoint_colors = cluster.color_values;
            for (uint p = 0; p < 16; p++)
            {
                for (uint s = 0; s < 4; s++)
                {
                    E2[p][s] = m_has_subblocks ? color::color_distance(m_params.m_perceptual, m_blocks[b][p], m_color_clusters[m_endpoint_indices[b << 1 | p >> 3].color].color_values[s], false) : color::color_distance(m_params.m_perceptual, m_blocks[b][p], endpoint_colors[s], false);
                }
            }
            for (uint p = 0; p < 8; p++)
            {
                for (uint s = 0; s < 16; s++)
                {
                    E4[p][s] = E2[p << 1][s & 3] + E2[p << 1 | 1][s >> 2];
                }
            }
            for (uint p = 0; p < 4; p++)
            {
                for (uint s = 0; s < 256; s++)
                {
                    E8[p][s] = E4[p << 1][s & 15] + E4[p << 1 | 1][s >> 4];
                }
            }
            uint best_index = 0;
            for (uint best_error = cUINT32_MAX, s = 0; s < m_color_selectors.size(); s++)
            {
                uint32 selector = m_color_selectors[s];
                uint error = E8[0][selector & 255] + E8[1][selector >> 8 & 255] + E8[2][selector >> 16 & 255] + E8[3][selector >> 24 & 255];
                if (error < best_error)
                {
                    best_error = error;
                    best_index = s;
                }
            }
            uint(&total_errors)[16][4] = selector_details[best_index].error;
            for (uint p = 0; p < 16; p++)
            {
                for (uint s = 0; s < 4; s++)
                {
                    total_errors[p][s] += E2[p][s];
                }
            }
            selector_details[best_index].used = true;
            m_selector_indices[m_has_subblocks ? b << 1 : b].color = best_index;
        }
    }